

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_mgr.cxx
# Opt level: O0

void __thiscall nuraft::nuraft_global_mgr::init_thread_pool(nuraft_global_mgr *this)

{
  long in_RDI;
  ptr<worker_handle> w_hdl_1;
  size_t ii_1;
  ptr<worker_handle> w_hdl;
  size_t ii;
  shared_ptr<nuraft::nuraft_global_mgr::worker_handle> *in_stack_fffffffffffffea8;
  shared_ptr<std::thread> *in_stack_fffffffffffffeb0;
  vector<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>,_std::allocator<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>_>_>
  *in_stack_fffffffffffffeb8;
  vector<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>,_std::allocator<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>_>_>
  *in_stack_fffffffffffffec0;
  vector<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>,_std::allocator<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>_>_>
  *this_00;
  shared_ptr<std::thread> local_e0;
  long local_d0;
  vector<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>,_std::allocator<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>_>_>
  local_c8 [2];
  code *local_98;
  undefined8 local_90;
  long local_78;
  ulong local_60;
  long local_50;
  undefined8 local_48;
  undefined4 local_3c;
  undefined8 local_38;
  long *local_30;
  long local_28;
  undefined8 local_20;
  undefined4 local_14;
  undefined8 local_10;
  long *local_8;
  
  for (local_60 = 0; local_60 < *(ulong *)(in_RDI + 0x38); local_60 = local_60 + 1) {
    local_8 = (long *)(in_RDI + 0x50);
    local_10 = 1;
    local_14 = 5;
    local_20 = 1;
    LOCK();
    local_78 = *local_8;
    *local_8 = *local_8 + 1;
    UNLOCK();
    local_28 = local_78;
    cs_new<nuraft::nuraft_global_mgr::worker_handle,unsigned_long>
              ((unsigned_long *)in_stack_fffffffffffffea8);
    local_98 = commit_worker_loop;
    local_90 = 0;
    cs_new<std::thread,void(nuraft::nuraft_global_mgr::*)(std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>),nuraft::nuraft_global_mgr*,std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>&>
              ((type *)in_stack_fffffffffffffeb8,(nuraft_global_mgr **)in_stack_fffffffffffffeb0,
               in_stack_fffffffffffffea8);
    std::
    __shared_ptr_access<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1f1eb0);
    std::shared_ptr<std::thread>::operator=
              (in_stack_fffffffffffffeb0,(shared_ptr<std::thread> *)in_stack_fffffffffffffea8);
    std::shared_ptr<std::thread>::~shared_ptr((shared_ptr<std::thread> *)0x1f1ed3);
    std::
    vector<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>,_std::allocator<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>_>_>
    ::push_back(in_stack_fffffffffffffec0,(value_type *)in_stack_fffffffffffffeb8);
    std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>::~shared_ptr
              ((shared_ptr<nuraft::nuraft_global_mgr::worker_handle> *)0x1f1ef5);
  }
  for (local_c8[0].
       super__Vector_base<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>,_std::allocator<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_c8[0].
      super__Vector_base<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>,_std::allocator<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage < *(pointer *)(in_RDI + 0x40);
      local_c8[0].
      super__Vector_base<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>,_std::allocator<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)((long)&((local_c8[0].
                              super__Vector_base<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>,_std::allocator<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                            super___shared_ptr<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2>
                            )._M_ptr + 1)) {
    local_30 = (long *)(in_RDI + 0x50);
    local_38 = 1;
    local_3c = 5;
    local_48 = 1;
    LOCK();
    local_d0 = *local_30;
    *local_30 = *local_30 + 1;
    UNLOCK();
    this_00 = local_c8;
    local_50 = local_d0;
    cs_new<nuraft::nuraft_global_mgr::worker_handle,unsigned_long>
              ((unsigned_long *)in_stack_fffffffffffffea8);
    cs_new<std::thread,void(nuraft::nuraft_global_mgr::*)(std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>),nuraft::nuraft_global_mgr*,std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>&>
              ((type *)in_stack_fffffffffffffeb8,(nuraft_global_mgr **)in_stack_fffffffffffffeb0,
               in_stack_fffffffffffffea8);
    in_stack_fffffffffffffeb8 = local_c8;
    std::
    __shared_ptr_access<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1f20c6);
    in_stack_fffffffffffffeb0 = &local_e0;
    std::shared_ptr<std::thread>::operator=
              (in_stack_fffffffffffffeb0,(shared_ptr<std::thread> *)in_stack_fffffffffffffea8);
    std::shared_ptr<std::thread>::~shared_ptr((shared_ptr<std::thread> *)0x1f20e6);
    std::
    vector<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>,_std::allocator<std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>_>_>
    ::push_back(this_00,(value_type *)in_stack_fffffffffffffeb8);
    std::shared_ptr<nuraft::nuraft_global_mgr::worker_handle>::~shared_ptr
              ((shared_ptr<nuraft::nuraft_global_mgr::worker_handle> *)0x1f2108);
  }
  return;
}

Assistant:

void nuraft_global_mgr::init_thread_pool() {
    for (size_t ii = 0; ii < config_.num_commit_threads_; ++ii) {
        ptr<worker_handle> w_hdl =
            cs_new<worker_handle>( thread_id_counter_.fetch_add(1) );
        w_hdl->thread_ = cs_new<std::thread>( &nuraft_global_mgr::commit_worker_loop,
                                              this,
                                              w_hdl );
        commit_workers_.push_back(w_hdl);
    }

    for (size_t ii = 0; ii < config_.num_append_threads_; ++ii) {
        ptr<worker_handle> w_hdl =
            cs_new<worker_handle>( thread_id_counter_.fetch_add(1) );
        w_hdl->thread_ = cs_new<std::thread>( &nuraft_global_mgr::append_worker_loop,
                                              this,
                                              w_hdl );
        append_workers_.push_back(w_hdl);
    }
}